

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O3

ON_Object * __thiscall ON__LayerExtensions::Internal_DeepCopy(ON__LayerExtensions *this)

{
  ON_UserData *this_00;
  
  this_00 = (ON_UserData *)operator_new(0xe0);
  ON_UserData::ON_UserData(this_00,&this->super_ON_UserData);
  (this_00->super_ON_Object)._vptr_ON_Object = (_func_int **)&PTR_ClassId_008124f0;
  this_00[1].super_ON_Object._vptr_ON_Object = (_func_int **)&PTR__ON_SimpleArray_00812620;
  this_00[1].super_ON_Object.m_userdata_list = (ON_UserData *)0x0;
  this_00[1].m_userdata_uuid.Data1 = 0;
  this_00[1].m_userdata_uuid.Data2 = 0;
  this_00[1].m_userdata_uuid.Data3 = 0;
  ON_SimpleArray<ON__LayerPerViewSettings>::operator=
            ((ON_SimpleArray<ON__LayerPerViewSettings> *)(this_00 + 1),&this->m_vp_settings);
  return &this_00->super_ON_Object;
}

Assistant:

ON__LayerExtensions* ON__LayerExtensions::LayerExtensions(const ON_Layer& layer, const unsigned char* layer_m_extension_bits, bool bCreate)
{
  ON__LayerExtensions* ud = ON__LayerExtensions::Cast(layer.GetUserData(ON_CLASS_ID(ON__LayerExtensions)));

  if ( 0 == ud )
  {
    if ( bCreate )
    {
      ud = new ON__LayerExtensions();
      const_cast<ON_Layer&>(layer).AttachUserData(ud);
      // Clear 0x01 bit of ON_Layer::m_extension_bits so 
      // ON_Layer visibility and color queries will check
      // for ON__LayerExtensions userdata.
      ClearExtensionBit( const_cast<unsigned char*>(layer_m_extension_bits), 0x01 );
    }
    else
    {
      // Set 0x01 bit of ON_Layer::m_extension_bits so 
      // ON_Layer visibility and color queries will not
      // perform the expensive check for ON__LayerExtensions 
      // userdata. This speeds up visibility and color queries 
      // that occur millions of times when complicated models
      // are rendered.
      SetExtensionBit( const_cast<unsigned char*>(layer_m_extension_bits), 0x01 );
    }
  }
  else
  {
    // Clear 0x01 bit of ON_Layer::m_extension_bits so 
    // ON_Layer visibility and color queries will check
    // for ON__LayerExtensions userdata.
    ClearExtensionBit( const_cast<unsigned char*>(layer_m_extension_bits), 0x01 );
  }

  return ud;
}